

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroup::QSequentialAnimationGroup
          (QSequentialAnimationGroup *this,QObject *parent)

{
  QAnimationGroupPrivate *dd;
  QObject *in_RDI;
  QSequentialAnimationGroupPrivate *in_stack_ffffffffffffffe0;
  
  dd = (QAnimationGroupPrivate *)operator_new(0xe8);
  QSequentialAnimationGroupPrivate::QSequentialAnimationGroupPrivate(in_stack_ffffffffffffffe0);
  QAnimationGroup::QAnimationGroup((QAnimationGroup *)in_stack_ffffffffffffffe0,dd,in_RDI);
  in_RDI->_vptr_QObject = (_func_int **)&PTR_metaObject_00be9f18;
  return;
}

Assistant:

QSequentialAnimationGroup::QSequentialAnimationGroup(QObject *parent)
    : QAnimationGroup(*new QSequentialAnimationGroupPrivate, parent)
{
}